

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O2

void * dmrC_allocator_allocate(allocator *A,size_t extra)

{
  undefined8 *__s;
  void *pvVar1;
  allocation_blob *paVar2;
  size_t __n;
  ulong uVar3;
  ulong size;
  ulong uVar4;
  allocation_blob *paVar5;
  ulong uVar6;
  size_t sVar7;
  
  __n = extra + A->size_;
  size = (ulong)A->chunking_;
  if (size < __n) {
    __assert_fail("size <= A->chunking_",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/allocate.c"
                  ,0x4d,"void *dmrC_allocator_allocate(struct allocator *, size_t)");
  }
  __s = (undefined8 *)A->freelist_;
  if (__s != (undefined8 *)0x0) {
    A->freelist_ = (void *)*__s;
    pvVar1 = memset(__s,0,__n);
    return pvVar1;
  }
  uVar6 = (ulong)A->alignment_;
  paVar5 = A->blobs_;
  A->allocations = A->allocations + 1;
  A->useful_bytes = A->useful_bytes + __n;
  uVar3 = (__n + uVar6) - 1 & -uVar6;
  if ((paVar5 == (allocation_blob *)0x0) || (uVar4 = paVar5->left, uVar4 < uVar3)) {
    paVar2 = (allocation_blob *)dmrC_blob_alloc(size);
    if (paVar2 == (allocation_blob *)0x0) {
      fwrite("out of memory\n",0xe,1,_stderr);
      abort();
    }
    A->total_bytes = A->total_bytes + size;
    paVar2->next = paVar5;
    A->blobs_ = paVar2;
    uVar6 = uVar6 + 0x17 & -uVar6;
    uVar4 = size - uVar6;
    paVar2->left = uVar4;
    sVar7 = uVar6 - 0x18;
    paVar2->offset = sVar7;
    paVar5 = paVar2;
  }
  else {
    sVar7 = paVar5->offset;
  }
  paVar5->offset = sVar7 + uVar3;
  paVar5->left = uVar4 - uVar3;
  return (void *)((long)&paVar5[1].next + sVar7);
}

Assistant:

void *dmrC_allocator_allocate(struct allocator *A, size_t extra) {
  size_t size = extra + A->size_;
  size_t alignment = A->alignment_;
  struct allocation_blob *blob = A->blobs_;
  void *retval;

  assert(size <= A->chunking_);
  /*
  * NOTE! The freelist only works with things that are
  *  (a) sufficiently aligned
  *  (b) use a constant size
  * Don't try to free allocators that don't follow
  * these rules.
  */
  if (A->freelist_) {
    void **p = (void **)A->freelist_;
    retval = p;
    A->freelist_ = *p;
    memset(retval, 0, size);
    return retval;
  }

  A->allocations++;
  A->useful_bytes += size;
  size = (size + alignment - 1) & ~(alignment - 1);
  if (!blob || blob->left < size) {
    size_t offset, chunking = A->chunking_;
    struct allocation_blob *newblob =
        (struct allocation_blob *)dmrC_blob_alloc(chunking);
    if (!newblob) {
      fprintf(stderr, "out of memory\n");
      abort();
    }
    A->total_bytes += chunking;
    newblob->next = blob;
    blob = newblob;
    A->blobs_ = newblob;
    offset = offsetof(struct allocation_blob, data);
    offset = (offset + alignment - 1) & ~(alignment - 1);
    blob->left = chunking - offset;
    blob->offset = offset - offsetof(struct allocation_blob, data);
  }
  retval = blob->data + blob->offset;
  blob->offset += size;
  blob->left -= size;
  return retval;
}